

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

xmlAutomataPtr xmlNewAutomata(void)

{
  xmlRegParserCtxtPtr ctxt;
  xmlRegStatePtr pxVar1;
  xmlRegParserCtxtPtr pxVar2;
  
  ctxt = xmlRegNewParserCtxt((xmlChar *)0x0);
  pxVar2 = (xmlRegParserCtxtPtr)0x0;
  if (ctxt != (xmlRegParserCtxtPtr)0x0) {
    pxVar1 = xmlRegStatePush(ctxt);
    ctxt->state = pxVar1;
    if (pxVar1 == (xmlRegStatePtr)0x0) {
      xmlRegFreeParserCtxt(ctxt);
      pxVar2 = (xmlRegParserCtxtPtr)0x0;
    }
    else {
      ctxt->start = pxVar1;
      ctxt->end = (xmlRegStatePtr)0x0;
      pxVar1->type = XML_REGEXP_START_STATE;
      ctxt->flags = 0;
      pxVar2 = ctxt;
    }
  }
  return pxVar2;
}

Assistant:

xmlAutomataPtr
xmlNewAutomata(void) {
    xmlAutomataPtr ctxt;

    ctxt = xmlRegNewParserCtxt(NULL);
    if (ctxt == NULL)
	return(NULL);

    /* initialize the parser */
    ctxt->state = xmlRegStatePush(ctxt);
    if (ctxt->state == NULL) {
	xmlFreeAutomata(ctxt);
	return(NULL);
    }
    ctxt->start = ctxt->state;
    ctxt->end = NULL;

    ctxt->start->type = XML_REGEXP_START_STATE;
    ctxt->flags = 0;

    return(ctxt);
}